

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qbytearray.cpp
# Opt level: O3

void __thiscall QByteArray::QByteArray(QByteArray *this,char *data,qsizetype size)

{
  long in_FS_OFFSET;
  QArrayData *d;
  QArrayDataPointer<char> local_48;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  (this->d).d = (Data *)0x0;
  (this->d).ptr = (char *)0x0;
  (this->d).size = 0;
  if (data == (char *)0x0) {
    local_48.ptr = (char *)0x0;
  }
  else {
    if (size < 0) {
      size = strlen(data);
    }
    if (size != 0) {
      local_48.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
      local_48.ptr = (char *)QArrayData::allocate1((QArrayData **)&local_48,size,KeepSize);
      local_48.size = size;
      QArrayDataPointer<char>::operator=(&this->d,&local_48);
      if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_48.d)->super_QArrayData,1,0x10);
        }
      }
      memcpy((this->d).ptr,data,size);
      (this->d).ptr[size] = '\0';
      goto LAB_00154849;
    }
    local_48.ptr = "";
  }
  local_48.size = 0;
  local_48.d = (Data *)0x0;
  QArrayDataPointer<char>::operator=(&this->d,&local_48);
  if (&(local_48.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_48.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_48.d)->super_QArrayData,1,0x10);
    }
  }
LAB_00154849:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QByteArray::QByteArray(const char *data, qsizetype size)
{
    if (!data) {
        d = DataPointer();
    } else {
        if (size < 0)
            size = qstrlen(data);
        if (!size) {
            d = DataPointer::fromRawData(&_empty, 0);
        } else {
            d = DataPointer(size, size);
            Q_CHECK_PTR(d.data());
            memcpy(d.data(), data, size);
            d.data()[size] = '\0';
        }
    }
}